

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_statemachine(Curl_easy *data,connectdata *conn)

{
  ushort *puVar1;
  byte *pbVar2;
  IMAP *pIVar3;
  curl_trc_feat *pcVar4;
  dynbuf *s;
  char cVar5;
  _Bool _Var6;
  unsigned_short uVar7;
  CURLcode CVar8;
  CURLcode CVar9;
  int iVar10;
  CURLofft CVar11;
  char *pcVar12;
  ulong uVar13;
  void *pvVar14;
  char *pcVar15;
  size_t sVar16;
  connectdata *pcVar17;
  byte *pbVar18;
  int imapcode;
  curl_off_t size;
  size_t nread;
  CURLcode local_84;
  connectdata *local_80;
  dynbuf *local_78;
  pingpong *local_70;
  dynbuf local_68;
  SASL *local_48;
  size_t local_40;
  char *local_38;
  
  local_40 = 0;
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
    CVar8 = imap_perform_upgrade_tls(data,conn);
    return CVar8;
  }
  local_70 = (pingpong *)&conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar8 = Curl_pp_flushsend(data,local_70);
    return CVar8;
  }
  local_78 = (dynbuf *)((long)&conn->proto + 0x60);
  local_48 = &(conn->proto).imapc.sasl;
  do {
    CVar9 = Curl_pp_readresp(data,0,local_70,(int *)&local_84,&local_40);
    CVar8 = local_84;
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    if (local_84 == ~CURLE_OK) {
      return CURLE_WEIRD_SERVER_REPLY;
    }
    if (local_84 == CURLE_OK) {
      return CURLE_OK;
    }
    switch((conn->proto).imapc.state) {
    case IMAP_SERVERGREET:
      pcVar17 = data->conn;
      if (local_84 != CURLE_UNSUPPORTED_PROTOCOL) {
        if (local_84 != CURLE_URL_MALFORMAT) {
          Curl_failf(data,"Got unexpected imap-server response");
          return CURLE_WEIRD_SERVER_REPLY;
        }
        pbVar18 = (byte *)((long)&pcVar17->proto + 0xfb);
        *pbVar18 = *pbVar18 | 2;
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))
           )) {
          Curl_infof(data,"PREAUTH connection, already authenticated");
        }
      }
      *(undefined2 *)((long)&pcVar17->proto + 0xb8) = 0;
      *(undefined2 *)((long)&pcVar17->proto + 0xbc) = 0;
      pbVar18 = (byte *)((long)&pcVar17->proto + 0xfb);
      *pbVar18 = *pbVar18 & 0xfb;
      CVar8 = imap_sendf(data,"CAPABILITY");
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
      (data->conn->proto).imapc.state = IMAP_CAPABILITY;
      goto LAB_0013bcb6;
    case IMAP_CAPABILITY:
      pcVar17 = data->conn;
      pcVar12 = Curl_dyn_ptr(&(pcVar17->proto).ftpc.pp.recvbuf);
      if (CVar8 == CURLE_ABORTED_BY_CALLBACK) {
        pbVar18 = (byte *)(pcVar12 + 2);
LAB_0013b71d:
        do {
          uVar13 = (ulong)*pbVar18;
          if (uVar13 < 0x21) {
            if ((0x100002600U >> (uVar13 & 0x3f) & 1) != 0) {
              pbVar18 = pbVar18 + 1;
              goto LAB_0013b71d;
            }
            if (uVar13 == 0) goto LAB_0013bcb6;
          }
          pcVar12 = (char *)0xfffffffffffffffb;
          while ((0x20 < (byte)uVar13 || ((0x100002601U >> (uVar13 & 0x3f) & 1) == 0))) {
            pbVar2 = pbVar18 + 6 + (long)pcVar12;
            pcVar12 = pcVar12 + 1;
            uVar13 = (ulong)*pbVar2;
          }
          pcVar15 = pcVar12 + 5;
          if (pcVar15 == (char *)0x7) {
            if (*(int *)(pbVar18 + 3) != 0x52492d4c || *(int *)pbVar18 != 0x4c534153)
            goto LAB_0013b800;
            pbVar2 = (byte *)((long)&pcVar17->proto + 0xfb);
            *pbVar2 = *pbVar2 | 0x10;
            pcVar15 = (char *)0x7;
          }
          else if (pcVar15 == (char *)0xd) {
            if (*(long *)(pbVar18 + 5) != 0x44454c4241534944 ||
                *(long *)pbVar18 != 0x5349444e49474f4c) goto LAB_0013b800;
            pbVar2 = (byte *)((long)&pcVar17->proto + 0xfb);
            *pbVar2 = *pbVar2 | 8;
            pcVar15 = (char *)0xd;
          }
          else if (pcVar15 == (char *)0x8) {
            if (*(long *)pbVar18 != 0x534c545452415453) goto LAB_0013b800;
            pbVar2 = (byte *)((long)&pcVar17->proto + 0xfb);
            *pbVar2 = *pbVar2 | 4;
            pcVar15 = (char *)0x8;
          }
          else if ((char *)0x5 < pcVar15) {
LAB_0013b800:
            if (pbVar18[4] == 0x3d && *(int *)pbVar18 == 0x48545541) {
              pbVar18 = pbVar18 + 5;
              uVar7 = Curl_sasl_decode_mech((char *)pbVar18,(size_t)pcVar12,(size_t *)&local_68);
              pcVar15 = pcVar12;
              if ((uVar7 != 0) && (local_68.bufr == pcVar12)) {
                puVar1 = (ushort *)((long)&pcVar17->proto + 0xb8);
                *puVar1 = *puVar1 | uVar7;
              }
            }
          }
          pbVar18 = pbVar18 + (long)pcVar15;
        } while( true );
      }
      if (((data->set).use_ssl != '\0') && (_Var6 = Curl_conn_is_ssl(pcVar17,0), !_Var6)) {
        if ((CVar8 == CURLE_UNSUPPORTED_PROTOCOL) &&
           ((*(byte *)((long)&pcVar17->proto + 0xfb) & 6) == 4)) {
          CVar8 = imap_sendf(data,"STARTTLS");
          if (CVar8 != CURLE_OK) {
            return CVar8;
          }
          (data->conn->proto).imapc.state = IMAP_STARTTLS;
          goto LAB_0013bcb6;
        }
        if (1 < (data->set).use_ssl) {
          pcVar12 = "STARTTLS not available.";
          goto LAB_0013bdc4;
        }
      }
LAB_0013bca5:
      CVar9 = imap_perform_authentication(data,pcVar17);
      break;
    case IMAP_STARTTLS:
      pcVar17 = data->conn;
      if ((pcVar17->proto).ftpc.pp.overflow != 0) {
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if (local_84 != CURLE_UNSUPPORTED_PROTOCOL) {
        if ((data->set).use_ssl != '\x01') {
          pcVar12 = "STARTTLS denied";
LAB_0013bdc4:
          Curl_failf(data,pcVar12);
          return CURLE_USE_SSL_FAILED;
        }
        goto LAB_0013bca5;
      }
      CVar9 = imap_perform_upgrade_tls(data,pcVar17);
      break;
    default:
      goto switchD_0013b5aa_caseD_4;
    case IMAP_AUTHENTICATE:
      CVar9 = Curl_sasl_continue(local_48,data,local_84,(saslprogress *)&local_68);
      if (CVar9 == CURLE_OK) {
        if ((int)local_68.bufr == 0) {
          if (((*(byte *)((long)&conn->proto + 0xfb) & 8) == 0) &&
             (((conn->proto).imapc.preftype & 1) != 0)) {
            CVar9 = imap_perform_login(data,conn);
          }
          else {
            Curl_failf(data,"Authentication cancelled");
            CVar9 = CURLE_LOGIN_DENIED;
          }
        }
        else {
          CVar9 = CURLE_OK;
          CVar8 = CURLE_OK;
          if ((int)local_68.bufr == 2) goto LAB_0013bbcc;
        }
      }
      break;
    case IMAP_LOGIN:
      if (local_84 != CURLE_UNSUPPORTED_PROTOCOL) {
        Curl_failf(data,"Access denied. %c",(ulong)local_84);
        return CURLE_LOGIN_DENIED;
      }
      goto switchD_0013b5aa_caseD_4;
    case IMAP_LIST:
    case IMAP_SEARCH:
      pcVar12 = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
      if (CVar8 == CURLE_UNSUPPORTED_PROTOCOL) goto switchD_0013b5aa_caseD_4;
      if (CVar8 != CURLE_ABORTED_BY_CALLBACK) {
        return CURLE_QUOTE_ERROR;
      }
      CVar9 = Curl_client_write(data,1,pcVar12,(data->conn->proto).ftpc.pp.nfinal);
      break;
    case IMAP_SELECT:
      local_80 = data->conn;
      pIVar3 = (data->req).p.imap;
      pcVar12 = Curl_dyn_ptr(&(local_80->proto).ftpc.pp.recvbuf);
      pcVar17 = local_80;
      if (CVar8 == CURLE_UNSUPPORTED_PROTOCOL) {
        if (((pIVar3->uidvalidity != (char *)0x0) &&
            (pcVar12 = (local_80->proto).ftpc.server_os, pcVar12 != (char *)0x0)) &&
           (iVar10 = curl_strequal(pIVar3->uidvalidity,pcVar12), iVar10 == 0)) {
          Curl_failf(data,"Mailbox UIDVALIDITY has changed");
          return CURLE_REMOTE_FILE_NOT_FOUND;
        }
        pcVar12 = (*Curl_cstrdup)(pIVar3->mailbox);
        (pcVar17->proto).imapc.mailbox = pcVar12;
        if (pcVar12 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        if (pIVar3->custom == (char *)0x0) {
          if (pIVar3->query == (char *)0x0) {
            CVar9 = imap_perform_fetch(data);
          }
          else {
            CVar9 = imap_perform_search(data);
          }
        }
        else {
          CVar9 = imap_perform_list(data);
        }
        break;
      }
      if (CVar8 != CURLE_ABORTED_BY_CALLBACK) {
        Curl_failf(data,"Select failed");
        return CURLE_LOGIN_DENIED;
      }
      iVar10 = curl_strnequal(pcVar12 + 2,"OK [UIDVALIDITY ",0x10);
      if (iVar10 != 0) {
        sVar16 = 0;
        do {
          cVar5 = (pcVar12 + 0x12)[sVar16];
          if (9 < (byte)(cVar5 - 0x30U)) {
            if (sVar16 != 0) goto LAB_0013bc01;
            goto LAB_0013bcb6;
          }
          sVar16 = sVar16 + 1;
        } while (sVar16 != 0x14);
        cVar5 = pcVar12[0x26];
        sVar16 = 0x14;
LAB_0013bc01:
        if (cVar5 == ']') {
          Curl_dyn_init(&local_68,0x14);
          CVar8 = Curl_dyn_addn(&local_68,pcVar12 + 0x12,sVar16);
          pcVar17 = local_80;
          if (CVar8 != CURLE_OK) {
            return CURLE_OUT_OF_MEMORY;
          }
          (*Curl_cfree)((local_80->proto).ftpc.server_os);
          (pcVar17->proto).ftpc.server_os = (char *)0x0;
          pcVar12 = Curl_dyn_ptr(&local_68);
          (pcVar17->proto).ftpc.server_os = pcVar12;
        }
      }
      goto LAB_0013bcb6;
    case IMAP_FETCH:
      pcVar12 = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
      local_68.bufr = (char *)0x0;
      if (CVar8 == CURLE_ABORTED_BY_CALLBACK) {
        pvVar14 = memchr(pcVar12,0x7b,(data->conn->proto).ftpc.pp.nfinal);
        if ((((pvVar14 == (void *)0x0) ||
             (CVar11 = curlx_strtoofft((char *)((long)pvVar14 + 1),&local_38,10,
                                       (curl_off_t *)&local_68), CVar11 != CURL_OFFT_OK)) ||
            ((long)local_38 - (long)pvVar14 < 2)) || (*local_38 != '}')) {
          Curl_failf(data,"Failed to parse FETCH response.");
          CVar8 = CURLE_WEIRD_SERVER_REPLY;
        }
        else {
          if ((((data->set).field_0x8cd & 0x10) != 0) &&
             ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
              (0 < pcVar4->log_level)))) {
            Curl_infof(data,"Found %ld bytes to download",local_68.bufr);
          }
          Curl_pgrsSetDownloadSize(data,(curl_off_t)local_68.bufr);
          s = local_78;
          pcVar12 = (char *)(conn->proto).ftpc.pp.overflow;
          if (pcVar12 == (char *)0x0) {
LAB_0013bd05:
            if ((char *)(data->req).bytecount != local_68.bufr) {
              (data->req).maxdownload = (curl_off_t)local_68.bufr;
              (data->state).select_bits = '\x01';
              Curl_xfer_setup1(data,1,(curl_off_t)local_68.bufr,false);
              CVar8 = CURLE_OK;
              goto LAB_0013bbcc;
            }
            Curl_xfer_setup_nop(data);
          }
          else {
            Curl_dyn_tail(local_78,(size_t)pcVar12);
            (conn->proto).ftpc.pp.nfinal = 0;
            if (local_68.bufr <= pcVar12) {
              pcVar12 = local_68.bufr;
            }
            if (local_68.bufr != (char *)0x0) {
              pcVar15 = Curl_dyn_ptr(s);
              CVar9 = Curl_client_write(data,1,pcVar15,(size_t)pcVar12);
              if (CVar9 != CURLE_OK) break;
              if ((((data->set).field_0x8cd & 0x10) != 0) &&
                 ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar4->log_level)))) {
                Curl_infof(data,"Written %zu bytes, %lu bytes are left for transfer",pcVar12);
              }
              pcVar15 = (char *)(conn->proto).ftpc.pp.overflow;
              sVar16 = (long)pcVar15 - (long)pcVar12;
              if (pcVar15 < pcVar12 || sVar16 == 0) {
                (conn->proto).ftpc.pp.overflow = 0;
                Curl_dyn_reset(local_78);
              }
              else {
                (conn->proto).ftpc.pp.overflow = sVar16;
                Curl_dyn_tail(local_78,sVar16);
              }
              goto LAB_0013bd05;
            }
          }
          CVar8 = CURLE_OK;
        }
      }
      else {
        Curl_pgrsSetDownloadSize(data,-1);
        CVar8 = CURLE_REMOTE_FILE_NOT_FOUND;
      }
LAB_0013bbcc:
      CVar9 = CVar8;
      (data->conn->proto).imapc.state = IMAP_STOP;
      break;
    case IMAP_FETCH_FINAL:
      if (local_84 != CURLE_UNSUPPORTED_PROTOCOL) {
        return CURLE_WEIRD_SERVER_REPLY;
      }
      goto switchD_0013b5aa_caseD_4;
    case IMAP_APPEND:
      if (local_84 != CURLE_BAD_FUNCTION_ARGUMENT) {
        return CURLE_UPLOAD_FAILED;
      }
      Curl_pgrsSetUploadSize(data,(data->state).infilesize);
      Curl_xfer_setup1(data,2,-1,false);
      goto switchD_0013b5aa_caseD_4;
    case IMAP_APPEND_FINAL:
      if (local_84 != CURLE_UNSUPPORTED_PROTOCOL) {
        return CURLE_UPLOAD_FAILED;
      }
switchD_0013b5aa_caseD_4:
      (data->conn->proto).imapc.state = IMAP_STOP;
      goto LAB_0013bcb6;
    }
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
LAB_0013bcb6:
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
    _Var6 = Curl_pp_moredata(local_70);
    if (!_Var6) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode imap_statemachine(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  int imapcode;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  size_t nread = 0;
  (void)data;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not IMAP */
  if(imapc->state == IMAP_UPGRADETLS)
    return imap_perform_upgrade_tls(data, conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(data, FIRSTSOCKET, pp, &imapcode, &nread);
    if(result)
      return result;

    /* Was there an error parsing the response line? */
    if(imapcode == -1)
      return CURLE_WEIRD_SERVER_REPLY;

    if(!imapcode)
      break;

    /* We have now received a full IMAP server response */
    switch(imapc->state) {
    case IMAP_SERVERGREET:
      result = imap_state_servergreet_resp(data, imapcode, imapc->state);
      break;

    case IMAP_CAPABILITY:
      result = imap_state_capability_resp(data, imapcode, imapc->state);
      break;

    case IMAP_STARTTLS:
      result = imap_state_starttls_resp(data, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE:
      result = imap_state_auth_resp(data, conn, imapcode, imapc->state);
      break;

    case IMAP_LOGIN:
      result = imap_state_login_resp(data, imapcode, imapc->state);
      break;

    case IMAP_LIST:
    case IMAP_SEARCH:
      result = imap_state_listsearch_resp(data, imapcode, imapc->state);
      break;

    case IMAP_SELECT:
      result = imap_state_select_resp(data, imapcode, imapc->state);
      break;

    case IMAP_FETCH:
      result = imap_state_fetch_resp(data, conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH_FINAL:
      result = imap_state_fetch_final_resp(data, imapcode, imapc->state);
      break;

    case IMAP_APPEND:
      result = imap_state_append_resp(data, imapcode, imapc->state);
      break;

    case IMAP_APPEND_FINAL:
      result = imap_state_append_final_resp(data, imapcode, imapc->state);
      break;

    case IMAP_LOGOUT:
    default:
      /* internal error */
      imap_state(data, IMAP_STOP);
      break;
    }
  } while(!result && imapc->state != IMAP_STOP && Curl_pp_moredata(pp));

  return result;
}